

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

void matchit::impl::IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
               (_Variadic_union<mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*> *v,
               _Variadic_union<mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*> value)

{
  _Variadic_union<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_28;
  undefined1 local_8;
  
  local_8 = 3;
  local_28._M_rest._M_rest = value;
  if (*(variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
        *)(v + 4) ==
      (variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
       )0x3) {
    *v = value;
  }
  else {
    std::
    variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
    ::emplace<3ul,mathiu::impl::Difference_const*>
              ((variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>
                *)&v->_M_first,(Difference **)&local_28);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                       *)&local_28);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }